

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# act_wiz.c
# Opt level: O0

void do_trust(CHAR_DATA *ch,char *argument)

{
  bool bVar1;
  int iVar2;
  int iVar3;
  CHAR_DATA *pCVar4;
  int level;
  CHAR_DATA *victim;
  char arg2 [4608];
  char arg1 [4608];
  undefined4 in_stack_ffffffffffffdbd8;
  undefined4 in_stack_ffffffffffffdbdc;
  int iVar5;
  char *in_stack_ffffffffffffdbe0;
  char in_stack_ffffffffffffdbe8;
  undefined7 in_stack_ffffffffffffdbe9;
  char *in_stack_ffffffffffffdbf0;
  char local_1218;
  char *in_stack_ffffffffffffffe0;
  CHAR_DATA *in_stack_ffffffffffffffe8;
  
  one_argument(in_stack_ffffffffffffdbe0,
               (char *)CONCAT44(in_stack_ffffffffffffdbdc,in_stack_ffffffffffffdbd8));
  one_argument(in_stack_ffffffffffffdbe0,
               (char *)CONCAT44(in_stack_ffffffffffffdbdc,in_stack_ffffffffffffdbd8));
  if (((local_1218 == '\0') || (in_stack_ffffffffffffdbe8 == '\0')) ||
     (bVar1 = is_number((char *)CONCAT44(in_stack_ffffffffffffdbdc,in_stack_ffffffffffffdbd8)),
     !bVar1)) {
    send_to_char(in_stack_ffffffffffffdbf0,
                 (CHAR_DATA *)CONCAT71(in_stack_ffffffffffffdbe9,in_stack_ffffffffffffdbe8));
    return;
  }
  pCVar4 = get_char_world(in_stack_ffffffffffffffe8,in_stack_ffffffffffffffe0);
  if (pCVar4 == (CHAR_DATA *)0x0) {
    send_to_char(in_stack_ffffffffffffdbf0,
                 (CHAR_DATA *)CONCAT71(in_stack_ffffffffffffdbe9,in_stack_ffffffffffffdbe8));
    return;
  }
  iVar2 = atoi(&stack0xffffffffffffdbe8);
  if ((-1 < iVar2) && (iVar2 < 0x3d)) {
    iVar5 = iVar2;
    iVar3 = get_trust((CHAR_DATA *)CONCAT44(iVar2,iVar2));
    if (iVar3 < iVar2) {
      send_to_char(in_stack_ffffffffffffdbf0,
                   (CHAR_DATA *)CONCAT71(in_stack_ffffffffffffdbe9,in_stack_ffffffffffffdbe8));
      return;
    }
    pCVar4->trust = (short)iVar5;
    return;
  }
  send_to_char(in_stack_ffffffffffffdbf0,
               (CHAR_DATA *)CONCAT71(in_stack_ffffffffffffdbe9,in_stack_ffffffffffffdbe8));
  return;
}

Assistant:

void do_trust(CHAR_DATA *ch, char *argument)
{
	char arg1[MAX_INPUT_LENGTH];
	char arg2[MAX_INPUT_LENGTH];
	CHAR_DATA *victim;
	int level;

	argument = one_argument(argument, arg1);
	argument = one_argument(argument, arg2);

	if (arg1[0] == '\0' || arg2[0] == '\0' || !is_number(arg2))
	{
		send_to_char("Syntax: trust <char> <level>.\n\r", ch);
		return;
	}

	victim = get_char_world(ch, arg1);

	if (victim == nullptr)
	{
		send_to_char("That player is not here.\n\r", ch);
		return;
	}

	level = atoi(arg2);

	if (level < 0 || level > 60)
	{
		send_to_char("Level must be 0 (reset) or 1 to 60.\n\r", ch);
		return;
	}

	if (level > get_trust(ch))
	{
		send_to_char("Limited to your trust.\n\r", ch);
		return;
	}

	victim->trust = level;
}